

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O3

void __thiscall
pstd::
vector<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>_>_>
::vector(vector<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>_>_>
         *this,size_t count,optional<std::pair<pbrt::LightHandle,_unsigned_long>_> *value,
        polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>_> *alloc)

{
  bool bVar1;
  undefined8 uVar2;
  optional<std::pair<pbrt::LightHandle,_unsigned_long>_> *poVar3;
  size_t sVar4;
  
  (this->alloc).memoryResource = alloc->memoryResource;
  this->ptr = (optional<std::pair<pbrt::LightHandle,_unsigned_long>_> *)0x0;
  this->nAlloc = 0;
  this->nStored = 0;
  reserve(this,count);
  if (count != 0) {
    bVar1 = value->set;
    poVar3 = this->ptr;
    sVar4 = count;
    do {
      poVar3->set = bVar1;
      if ((bVar1 & 1U) != 0) {
        (poVar3->optionalValue).__align = (anon_struct_8_0_00000001_for___align)0x0;
        uVar2 = *(undefined8 *)((long)&value->optionalValue + 8);
        (poVar3->optionalValue).__align = (value->optionalValue).__align;
        *(undefined8 *)((long)&poVar3->optionalValue + 8) = uVar2;
      }
      poVar3 = poVar3 + 1;
      sVar4 = sVar4 - 1;
    } while (sVar4 != 0);
  }
  this->nStored = count;
  return;
}

Assistant:

vector(size_t count, const T &value, const Allocator &alloc = {}) : alloc(alloc) {
        reserve(count);
        for (size_t i = 0; i < count; ++i)
            this->alloc.template construct<T>(ptr + i, value);
        nStored = count;
    }